

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::arrayOrStreamToStreamArray
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this,string *description,string *all_description)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer pQVar3;
  uint uVar4;
  __index_type _Var5;
  bool bVar6;
  uint uVar7;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  undefined8 *puVar9;
  QPDFObjGen *pQVar10;
  long *plVar11;
  ulong uVar12;
  QPDFObjGen QVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var14;
  QPDF *qpdf;
  uint __len;
  uint __val;
  pointer pQVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  Array array;
  string local_1c0;
  string local_1a0;
  ulong *local_180;
  long local_178;
  ulong local_170 [2];
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  uint local_13c;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  Array local_118;
  QPDFObjectHandle local_f8;
  string *local_e8;
  QPDF *local_e0;
  string *local_d8;
  string local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  _Alloc_hider _Stack_98;
  
  local_e8 = description;
  local_d8 = all_description;
  std::__cxx11::string::_M_assign((string *)all_description);
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_001c6280:
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    _Var5 = (peVar1->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var5 == '\x0f') {
      pvVar8 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar1->value);
LAB_001c623e:
      _Var5 = *(__index_type *)
               ((long)&(((pvVar8->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var5 == '\r') {
      pvVar8 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(peVar1->qpdf,*(QPDFObjGen *)&(peVar1->og).obj);
      goto LAB_001c623e;
    }
    if (_Var5 != '\b') goto LAB_001c6280;
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    local_118.sp_elements._M_t.
    super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    .
    super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            )0x0;
    if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      local_13c = ::qpdf::Array::size(&local_118);
      if (0 < (int)local_13c) {
        __val = 0;
        do {
          ::qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&local_b0,&local_118,__val);
          local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_a8;
          local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Stack_a0;
          bVar6 = isStream(&local_f8);
          if (bVar6) {
            std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
            emplace_back<QPDFObjectHandle&>
                      ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                       __return_storage_ptr__,&local_f8);
          }
          else {
            if (local_f8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              local_e0 = (QPDF *)0x0;
            }
            else {
              local_e0 = (local_f8.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf;
            }
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
            local_180 = local_170;
            pcVar2 = (local_e8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,pcVar2,pcVar2 + local_e8->_M_string_length);
            std::__cxx11::string::append((char *)&local_180);
            __len = 1;
            if (9 < __val) {
              uVar12 = (ulong)__val;
              uVar4 = 4;
              do {
                __len = uVar4;
                uVar7 = (uint)uVar12;
                if (uVar7 < 100) {
                  __len = __len - 2;
                  goto LAB_001c64ed;
                }
                if (uVar7 < 1000) {
                  __len = __len - 1;
                  goto LAB_001c64ed;
                }
                if (uVar7 < 10000) goto LAB_001c64ed;
                uVar12 = uVar12 / 10000;
                uVar4 = __len + 4;
              } while (99999 < uVar7);
              __len = __len + 1;
            }
LAB_001c64ed:
            local_138 = local_128;
            std::__cxx11::string::_M_construct((ulong)&local_138,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_138,__len,__val);
            uVar12 = 0xf;
            if (local_180 != local_170) {
              uVar12 = local_170[0];
            }
            if (uVar12 < (ulong)(local_130 + local_178)) {
              uVar12 = 0xf;
              if (local_138 != local_128) {
                uVar12 = local_128[0];
              }
              if (uVar12 < (ulong)(local_130 + local_178)) goto LAB_001c657c;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_138,0,(char *)0x0,(ulong)local_180);
            }
            else {
LAB_001c657c:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_138);
            }
            local_160 = &local_150;
            plVar11 = puVar9 + 2;
            if ((long *)*puVar9 == plVar11) {
              local_150 = *plVar11;
              uStack_148 = puVar9[3];
            }
            else {
              local_150 = *plVar11;
              local_160 = (long *)*puVar9;
            }
            local_158 = puVar9[1];
            *puVar9 = plVar11;
            puVar9[1] = 0;
            *(undefined1 *)plVar11 = 0;
            pQVar10 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_160);
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            QVar13 = (QPDFObjGen)(pQVar10 + 2);
            if (*pQVar10 == QVar13) {
              local_1a0.field_2._M_allocated_capacity = *(undefined8 *)QVar13;
              local_1a0.field_2._8_4_ = pQVar10[3].obj;
              local_1a0.field_2._12_4_ = pQVar10[3].gen;
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *(undefined8 *)QVar13;
              local_1a0._M_dataplus._M_p = (pointer)*pQVar10;
            }
            local_1a0._M_string_length = *(size_type *)(pQVar10 + 1);
            *pQVar10 = QVar13;
            pQVar10[1].obj = 0;
            pQVar10[1].gen = 0;
            *(undefined1 *)&pQVar10[2].obj = 0;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"ignoring non-stream in an array of streams","");
            QPDFExc::QPDFExc((QPDFExc *)&local_b0,qpdf_e_damaged_pdf,&local_1c0,&local_1a0,0,
                             &local_d0);
            warn(local_e0,(QPDFExc *)&local_b0);
            QPDFExc::~QPDFExc((QPDFExc *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_160 != &local_150) {
              operator_delete(local_160,local_150 + 1);
            }
            if (local_138 != local_128) {
              operator_delete(local_138,local_128[0] + 1);
            }
            if (local_180 != local_170) {
              operator_delete(local_180,local_170[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_f8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          __val = __val + 1;
        } while (__val != local_13c);
      }
      goto LAB_001c6773;
    }
  }
  local_118.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  bVar6 = isStream(this);
  if (bVar6) {
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::emplace_back<QPDFObjectHandle&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__,
               this);
  }
  else {
    bVar6 = isNull(this);
    if (!bVar6) {
      peVar1 = (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        qpdf = (QPDF *)0x0;
      }
      else {
        qpdf = peVar1->qpdf;
      }
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,
                 " object is supposed to be a stream or an array of streams but is neither","");
      QPDFExc::QPDFExc((QPDFExc *)&local_b0,qpdf_e_damaged_pdf,&local_1c0,local_e8,0,&local_1a0);
      warn(qpdf,(QPDFExc *)&local_b0);
      QPDFExc::~QPDFExc((QPDFExc *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_001c6773:
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_118.sp_elements);
  if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pQVar15 = (__return_storage_ptr__->
            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pQVar3 = (__return_storage_ptr__->
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar15 != pQVar3) {
    bVar6 = true;
    do {
      if (!bVar6) {
        std::__cxx11::string::append((char *)local_d8);
      }
      peVar1 = (pQVar15->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        local_1a0._M_dataplus._M_p._0_4_ = 0;
        local_1a0._M_dataplus._M_p._4_4_ = 0;
      }
      else {
        local_1a0._M_dataplus._M_p = *(pointer *)&peVar1->og;
      }
      QPDFObjGen::unparse_abi_cxx11_(&local_1c0,(QPDFObjGen *)&local_1a0,' ');
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x28461f);
      pp_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar11 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11 == pp_Var14) {
        p_Stack_a0 = *pp_Var14;
        _Stack_98._M_p = (pointer)plVar11[3];
        local_b0 = &p_Stack_a0;
      }
      else {
        p_Stack_a0 = *pp_Var14;
        local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11;
      }
      local_a8 = (element_type *)plVar11[1];
      *plVar11 = (long)pp_Var14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_b0);
      if (local_b0 != &p_Stack_a0) {
        operator_delete(local_b0,(ulong)((long)&p_Stack_a0->_vptr__Sp_counted_base + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      pQVar15 = pQVar15 + 1;
      bVar6 = false;
    } while (pQVar15 != pQVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::arrayOrStreamToStreamArray(
    std::string const& description, std::string& all_description)
{
    all_description = description;
    std::vector<QPDFObjectHandle> result;
    if (auto array = as_array(strict)) {
        int n_items = array.size();
        for (int i = 0; i < n_items; ++i) {
            QPDFObjectHandle item = array.at(i).second;
            if (item.isStream()) {
                result.emplace_back(item);
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle non-stream in stream array");
                warn(
                    item.getOwningQPDF(),
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        "",
                        description + ": item index " + std::to_string(i) + " (from 0)",
                        0,
                        "ignoring non-stream in an array of streams"));
            }
        }
    } else if (isStream()) {
        result.emplace_back(*this);
    } else if (!isNull()) {
        warn(
            getOwningQPDF(),
            QPDFExc(
                qpdf_e_damaged_pdf,
                "",
                description,
                0,
                " object is supposed to be a stream or an array of streams but is neither"));
    }

    bool first = true;
    for (auto const& item: result) {
        if (first) {
            first = false;
        } else {
            all_description += ",";
        }
        all_description += " stream " + item.getObjGen().unparse(' ');
    }

    return result;
}